

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O3

void Map_SuperTableResize(Map_HashTable_t *p)

{
  uint uVar1;
  Map_HashEntry_t **ppMVar2;
  Map_HashEntry_t *pMVar3;
  ulong uVar4;
  Map_HashEntry_t *pMVar5;
  uint uVar6;
  Map_HashEntry_t **ppMVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar1 = p->nBins;
  uVar9 = uVar1 * 2 - 1;
  while( true ) {
    do {
      uVar10 = uVar9 + 1;
      uVar6 = uVar9 & 1;
      uVar9 = uVar10;
    } while (uVar6 != 0);
    if (uVar10 < 9) break;
    iVar8 = 5;
    while (uVar10 % (iVar8 - 2U) != 0) {
      uVar6 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar10 < uVar6) goto LAB_00407150;
    }
  }
LAB_00407150:
  ppMVar7 = (Map_HashEntry_t **)calloc(1,(long)(int)uVar10 << 3);
  if ((int)uVar1 < 1) {
    iVar8 = 0;
  }
  else {
    ppMVar2 = p->pBins;
    uVar11 = 0;
    iVar8 = 0;
    do {
      pMVar5 = ppMVar2[uVar11];
      while (pMVar5 != (Map_HashEntry_t *)0x0) {
        pMVar3 = pMVar5->pNext;
        uVar4 = (ulong)(pMVar5->uTruth[1] * 0x7d3 + pMVar5->uTruth[0]) % (ulong)uVar10;
        pMVar5->pNext = ppMVar7[uVar4];
        ppMVar7[uVar4] = pMVar5;
        iVar8 = iVar8 + 1;
        pMVar5 = pMVar3;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
  }
  if (iVar8 == p->nEntries) {
    if (p->pBins != (Map_HashEntry_t **)0x0) {
      free(p->pBins);
    }
    p->pBins = ppMVar7;
    p->nBins = uVar10;
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperTable.c"
                ,0xff,"void Map_SuperTableResize(Map_HashTable_t *)");
}

Assistant:

void Map_SuperTableResize( Map_HashTable_t * p )
{
    Map_HashEntry_t ** pBinsNew;
    Map_HashEntry_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    unsigned Key;
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Map_HashEntry_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Map_HashEntry_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i], pEnt2 = pEnt? pEnt->pNext: NULL; pEnt; 
              pEnt = pEnt2, pEnt2 = pEnt? pEnt->pNext: NULL )
        {
            Key = MAP_TABLE_HASH( pEnt->uTruth[0], pEnt->uTruth[1], nBinsNew );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}